

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O0

Lit __thiscall Minisat::Clause::subsumes(Clause *this,Clause *other)

{
  bool bVar1;
  Lit p;
  Lit *pLVar2;
  Lit *pLVar3;
  uint local_40;
  uint local_3c;
  uint j;
  uint i;
  Lit *d;
  Lit *c;
  anon_struct_4_5_613047fb_for_header *paStack_20;
  Lit ret;
  Clause *other_local;
  Clause *this_local;
  
  paStack_20 = &other->header;
  if (((uint)this->header >> 2 & 1) != 0) {
    __assert_fail("!header.learnt",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                  ,0x1ba,"Lit Minisat::Clause::subsumes(const Clause &) const");
  }
  if (((uint)other->header >> 2 & 1) != 0) {
    __assert_fail("!other.header.learnt",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                  ,0x1ba,"Lit Minisat::Clause::subsumes(const Clause &) const");
  }
  if (((uint)this->header >> 3 & 1) == 0) {
    __assert_fail("header.has_extra",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                  ,0x1bb,"Lit Minisat::Clause::subsumes(const Clause &) const");
  }
  if (((uint)other->header >> 3 & 1) == 0) {
    __assert_fail("other.header.has_extra",
                  "/workspace/llm4binary/github/license_c_cmakelists/stp[P]minisat/minisat/core/SolverTypes.h"
                  ,0x1bb,"Lit Minisat::Clause::subsumes(const Clause &) const");
  }
  if (((uint)other->header >> 5 < (uint)this->header >> 5) ||
     (((uint)this[(ulong)((uint)this->header >> 5) + 1].header &
      ((uint)other[(ulong)((uint)other->header >> 5) + 1].header ^ 0xffffffff)) != 0)) {
    return (Lit)-1;
  }
  c._4_4_ = -2;
  pLVar2 = operator_cast_to_Lit_(this);
  pLVar3 = operator_cast_to_Lit_((Clause *)paStack_20);
  local_3c = 0;
LAB_001225b8:
  if ((uint)this->header >> 5 <= local_3c) {
    return (Lit)c._4_4_;
  }
  local_40 = 0;
  do {
    if ((uint)*paStack_20 >> 5 <= local_40) {
      return (Lit)-1;
    }
    bVar1 = Lit::operator==(pLVar2 + local_3c,(Lit)pLVar3[local_40].x);
    if (bVar1) goto LAB_00122698;
    bVar1 = Lit::operator==((Lit *)((long)&c + 4),(Lit)0xfffffffe);
    if (bVar1) {
      p = operator~(pLVar3[local_40].x);
      bVar1 = Lit::operator==(pLVar2 + local_3c,p);
      if (bVar1) break;
    }
    local_40 = local_40 + 1;
  } while( true );
  c._4_4_ = pLVar2[local_3c].x;
LAB_00122698:
  local_3c = local_3c + 1;
  goto LAB_001225b8;
}

Assistant:

inline Lit Clause::subsumes(const Clause& other) const
{
    //if (other.size() < size() || (extra.abst & ~other.extra.abst) != 0)
    //if (other.size() < size() || (!learnt() && !other.learnt() && (extra.abst & ~other.extra.abst) != 0))
    assert(!header.learnt);   assert(!other.header.learnt);
    assert(header.has_extra); assert(other.header.has_extra);
    if (other.header.size < header.size || (data[header.size].abs & ~other.data[other.header.size].abs) != 0)
        return lit_Error;

    Lit        ret = lit_Undef;
    const Lit* c   = (const Lit*)(*this);
    const Lit* d   = (const Lit*)other;

    for (unsigned i = 0; i < header.size; i++) {
        // search for c[i] or ~c[i]
        for (unsigned j = 0; j < other.header.size; j++)
            if (c[i] == d[j])
                goto ok;
            else if (ret == lit_Undef && c[i] == ~d[j]){
                ret = c[i];
                goto ok;
            }

        // did not find it
        return lit_Error;
    ok:;
    }

    return ret;
}